

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O1

void __thiscall QLCDNumber::setDigitCount(QLCDNumber *this,int numDigits)

{
  QString *this_00;
  QBitArray *this_01;
  uint uVar1;
  long lVar2;
  QArrayData *pQVar3;
  long lVar4;
  char16_t *pcVar5;
  qsizetype extraout_RDX;
  qsizetype extraout_RDX_00;
  qsizetype qVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong i;
  ulong n;
  QBitArray *ba;
  long in_FS_OFFSET;
  R_conflict2 RVar10;
  QString local_58;
  long local_38;
  
  n = (ulong)(uint)numDigits;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  if (99 < numDigits) {
    setDigitCount(this);
    n = 99;
  }
  if ((int)n < 0) {
    setDigitCount(this);
    n = 0;
  }
  this_00 = (QString *)(lVar2 + 0x290);
  iVar7 = (int)n;
  if (*(long *)(lVar2 + 0x298) == 0) {
    *(int *)(lVar2 + 0x278) = iVar7;
    QString::fill((QChar)(char16_t)this_00,0x20);
    QBitArray::fill((QBitArray *)(lVar2 + 0x2a8),false,(long)*(int *)(lVar2 + 0x278));
    iVar7 = *(int *)(lVar2 + 0x278);
    if ((*(int **)(lVar2 + 0x290) == (int *)0x0) || (1 < **(int **)(lVar2 + 0x290))) {
      QString::reallocData((longlong)this_00,(AllocationOption)*(undefined8 *)(lVar2 + 0x2a0));
    }
    *(undefined2 *)(*(long *)(lVar2 + 0x298) + -2 + (long)iVar7 * 2) = 0x30;
  }
  else {
    uVar1 = *(uint *)(lVar2 + 0x278);
    uVar9 = iVar7 - uVar1;
    if (uVar9 != 0) {
      if (uVar9 == 0 || iVar7 < (int)uVar1) {
        QString::right(&local_58,this_00,n);
        pQVar3 = *(QArrayData **)(lVar2 + 0x290);
        pcVar5 = *(char16_t **)(lVar2 + 0x298);
        *(Data **)(lVar2 + 0x290) = local_58.d.d;
        *(char16_t **)(lVar2 + 0x298) = local_58.d.ptr;
        qVar6 = *(qsizetype *)(lVar2 + 0x2a0);
        *(qsizetype *)(lVar2 + 0x2a0) = local_58.d.size;
        local_58.d.d = (Data *)pQVar3;
        local_58.d.ptr = pcVar5;
        local_58.d.size = qVar6;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
        pQVar3 = *(QArrayData **)(lVar2 + 0x2a8);
        lVar4 = *(long *)(lVar2 + 0x2b0);
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QBitArray::resize((longlong)(lVar2 + 0x2a8));
        if (iVar7 != 0) {
          i = 0;
          do {
            QBitArray::setBit((QBitArray *)(lVar2 + 0x2a8),i,
                              (*(byte *)(lVar4 + 1 + (long)((int)((uVar1 - iVar7) + (int)i) >> 3))
                               >> ((uint)(byte)((char)uVar1 - (char)n) + (int)i & 7) & 1) != 0);
            i = i + 1;
          } while (n != i);
        }
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,1,0x10);
          }
        }
      }
      else {
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char16_t *)0x0;
        local_58.d.size = 0;
        QString::fill((QChar)(char16_t)&local_58,0x20);
        pcVar5 = local_58.d.ptr;
        if (local_58.d.ptr == (char16_t *)0x0) {
          pcVar5 = (char16_t *)&QString::_empty;
        }
        QString::insert((longlong)this_00,(QChar *)0x0,(longlong)pcVar5);
        this_01 = (QBitArray *)(lVar2 + 0x2a8);
        QBitArray::resize((longlong)this_01);
        qVar6 = extraout_RDX;
        uVar8 = uVar1;
        if (0 < (int)uVar1) {
          do {
            uVar8 = uVar8 - 1;
            n = n - 1;
            QBitArray::setBit(this_01,n,
                              (*(byte *)(*(long *)(lVar2 + 0x2b0) + 1 + (long)((int)uVar8 >> 3)) >>
                               (uVar8 & 7) & 1) != 0);
            qVar6 = extraout_RDX_00;
          } while ((long)(int)uVar9 < (long)n);
        }
        if (0 < (int)uVar9) {
          ba = (QBitArray *)0x0;
          do {
            RVar10 = QBitArray::bitLocation<QBitArray>(this_01,ba,qVar6);
            qVar6 = CONCAT71(RVar10._9_7_,~RVar10.bitMask);
            *RVar10.byte = *RVar10.byte & ~RVar10.bitMask;
            ba = (QBitArray *)((long)&(ba->d).d.d + 1);
          } while ((QBitArray *)(ulong)uVar9 != ba);
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      *(int *)(lVar2 + 0x278) = iVar7;
      if (uVar1 == 0) {
        display(this,*(double *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x280));
      }
      QWidget::update((QWidget *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::setDigitCount(int numDigits)
{
    Q_D(QLCDNumber);
    if (Q_UNLIKELY(numDigits > 99)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Max 99 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 99;
    }
    if (Q_UNLIKELY(numDigits < 0)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Min 0 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 0;
    }
    if (d->digitStr.isNull()) {                  // from constructor
        d->ndigits = numDigits;
        d->digitStr.fill(u' ', d->ndigits);
        d->points.fill(0, d->ndigits);
        d->digitStr[d->ndigits - 1] = u'0'; // "0" is the default number
    } else {
        bool doDisplay = d->ndigits == 0;
        if (numDigits == d->ndigits)             // no change
            return;
        int i;
        int dif;
        if (numDigits > d->ndigits) {            // expand
            dif = numDigits - d->ndigits;
            QString buf;
            buf.fill(u' ', dif);
            d->digitStr.insert(0, buf);
            d->points.resize(numDigits);
            for (i=numDigits-1; i>=dif; i--)
                d->points.setBit(i, d->points.testBit(i-dif));
            for (i=0; i<dif; i++)
                d->points.clearBit(i);
        } else {                                        // shrink
            dif = d->ndigits - numDigits;
            d->digitStr = d->digitStr.right(numDigits);
            QBitArray tmpPoints = d->points;
            d->points.resize(numDigits);
            for (i=0; i<numDigits; i++)
                d->points.setBit(i, tmpPoints.testBit(i+dif));
        }
        d->ndigits = numDigits;
        if (doDisplay)
            display(value());
        update();
    }
}